

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionControlElement::~IfcDistributionControlElement
          (IfcDistributionControlElement *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x873b18;
  *(undefined8 *)&this->field_0x180 = 0x873c30;
  *(undefined8 *)&this->field_0x88 = 0x873b40;
  *(undefined8 *)&this->field_0x98 = 0x873b68;
  *(undefined8 *)&this->field_0xd0 = 0x873b90;
  *(undefined8 *)&this->field_0x100 = 0x873bb8;
  *(undefined8 *)&this->field_0x138 = 0x873be0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0x873c08;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>)
             .field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
            field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__00873c50);
  operator_delete(this,0x198);
  return;
}

Assistant:

IfcDistributionControlElement() : Object("IfcDistributionControlElement") {}